

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
Subst_Backward(TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
               *this,TPZFMatrix<long_double> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00005214;
  TPZFMatrix<long_double> *in_stack_00005218;
  TPZFileEqnStorage<long_double> *in_stack_00005220;
  
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<long_double>::GetDecomposeType((TPZFront<long_double> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<long_double>::Backward(in_stack_00005220,in_stack_00005218,in_stack_00005214);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}